

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::StreamingReporterBase
          (StreamingReporterBase *this,ReporterConfig *_config)

{
  ostream *poVar1;
  ReporterConfig *in_RSI;
  undefined8 *in_RDI;
  ReporterConfig *in_stack_ffffffffffffffa8;
  LazyStat<Catch::TestRunInfo> *in_stack_ffffffffffffffb0;
  LazyStat<Catch::TestCaseInfo> *this_00;
  
  SharedImpl<Catch::IStreamingReporter>::SharedImpl
            ((SharedImpl<Catch::IStreamingReporter> *)in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__StreamingReporterBase_002c2020;
  ReporterConfig::fullConfig(in_stack_ffffffffffffffa8);
  poVar1 = ReporterConfig::stream(in_RSI);
  in_RDI[3] = poVar1;
  LazyStat<Catch::TestRunInfo>::LazyStat(in_stack_ffffffffffffffb0);
  this_00 = (LazyStat<Catch::TestCaseInfo> *)(in_RDI + 10);
  LazyStat<Catch::GroupInfo>::LazyStat((LazyStat<Catch::GroupInfo> *)this_00);
  LazyStat<Catch::TestCaseInfo>::LazyStat(this_00);
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::vector
            ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)0x27c1eb);
  return;
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {}